

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

bool __thiscall
glcts::ViewportArray::DrawTestBase::checkRegionR32I
          (DrawTestBase *this,GLuint x,GLuint y,GLuint width,GLuint height,GLint expected_value,
          GLint *data)

{
  ostringstream *this_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  if (height != 0) {
    uVar2 = height * y * 0x80 + width * x;
    bVar6 = false;
    uVar3 = 0;
    do {
      uVar4 = (ulong)width;
      uVar5 = uVar2;
      if (width != 0) {
        do {
          iVar1 = data[uVar5];
          if (iVar1 != expected_value) {
            local_1b0._0_8_ = ((this->super_TestCaseBase).m_context)->m_testCtx->m_log;
            this_00 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Invalid result. Region (",0x18);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"x",1);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"). Expected: ",0xd);
            std::ostream::operator<<(this_00,expected_value);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," got ",5);
            std::ostream::operator<<(this_00,iVar1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            return bVar6;
          }
          uVar5 = uVar5 + 1;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      uVar3 = uVar3 + 1;
      uVar2 = uVar2 + 0x80;
      bVar6 = height <= uVar3;
    } while (uVar3 != height);
  }
  return true;
}

Assistant:

bool DrawTestBase::checkRegionR32I(GLuint x, GLuint y, GLuint width, GLuint height, GLint expected_value, GLint* data)
{
	bool result = true;

	const GLuint offset = (y * height * m_width) + (x * width);

	for (GLuint line = 0; line < height; ++line)
	{
		const GLuint line_offset = offset + line * m_width;

		for (GLuint texel = 0; texel < width; ++texel)
		{
			const GLuint texel_offset = line_offset + texel;

			const GLint value = data[texel_offset];

			if (expected_value != value)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid result. Region (" << x << "x"
													<< y << "). Expected: " << expected_value << " got " << value
													<< tcu::TestLog::EndMessage;

				result = false;
				goto end;
			}
		}
	}

end:
	return result;
}